

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_agent_core_stats.cpp
# Opt level: O1

void __thiscall
so_5::stats::impl::ds_agent_core_stats_t::distribute
          (ds_agent_core_stats_t *this,mbox_t *distribution_mbox)

{
  coop_repository_stats_t stats;
  suffix_t local_78;
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  prefix_t local_50;
  
  (*this->m_what->_vptr_environment_infrastructure_t[0xd])(&local_70);
  prefixes::coop_repository();
  local_78 = suffixes::coop_reg_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            (distribution_mbox,&local_50,&local_78,&local_70);
  prefixes::coop_repository();
  local_78 = suffixes::coop_dereg_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            (distribution_mbox,&local_50,&local_78,&local_68);
  prefixes::coop_repository();
  local_78 = suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            (distribution_mbox,&local_50,&local_78,&local_60);
  prefixes::coop_repository();
  local_78 = suffixes::coop_final_dereg_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            (distribution_mbox,&local_50,&local_78,&local_58);
  return;
}

Assistant:

void
ds_agent_core_stats_t::distribute(
	const mbox_t & distribution_mbox )
	{
		auto stats = m_what.query_coop_repository_stats();

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::coop_reg_count(),
				stats.m_registered_coop_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::coop_dereg_count(),
				stats.m_deregistered_coop_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::agent_count(),
				stats.m_total_agent_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::coop_final_dereg_count(),
				stats.m_final_dereg_coop_count );
	}